

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_still.cpp
# Opt level: O0

void __thiscall raspicam::RaspiCam_Still::RaspiCam_Still(RaspiCam_Still *this)

{
  Private_Impl_Still *this_00;
  undefined8 *in_RDI;
  
  this_00 = (Private_Impl_Still *)operator_new(0x80);
  _private::Private_Impl_Still::Private_Impl_Still(this_00);
  *in_RDI = this_00;
  return;
}

Assistant:

RaspiCam_Still::RaspiCam_Still() {
        _impl= new _private::Private_Impl_Still() ;
    }